

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::Do_Call<std::__cxx11::string>::
go<std::__cxx11::string(chaiscript::AST_Node_const&,std::__cxx11::string_const&),chaiscript::dispatch::detail::Const_Caller<std::__cxx11::string,chaiscript::AST_Node,std::__cxx11::string_const&>>
          (Do_Call<std::__cxx11::string> *this,
          Const_Caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::AST_Node,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *fun,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  detail local_31;
  string local_30 [32];
  
  call_func<chaiscript::dispatch::detail::Const_Caller<std::__cxx11::string,chaiscript::AST_Node,std::__cxx11::string_const&>,std::__cxx11::string,chaiscript::AST_Node_const&,std::__cxx11::string_const&,0ul,1ul>
            (local_30,&local_31,fun,params,t_conversions);
  Handle_Return<std::__cxx11::string>::handle<std::__cxx11::string,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string(local_30);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value go(const Callable &fun, const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
          {
            return Handle_Return<Ret>::handle(call_func(Function_Signature<Signature>(), fun, params, t_conversions));
          }